

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

void __thiscall cmCTestHandlerCommand::BindArguments(cmCTestHandlerCommand *this)

{
  static_string_view sVar1;
  cmCTestHandlerCommand *this_local;
  
  cmArgumentParser<void>::BindParsedKeywords
            (&this->super_cmArgumentParser<void>,&this->ParsedKeywords);
  sVar1 = ::cm::operator____s("APPEND",6);
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,sVar1,&this->Append);
  sVar1 = ::cm::operator____s("QUIET",5);
  cmArgumentParser<void>::Bind<bool>(&this->super_cmArgumentParser<void>,sVar1,&this->Quiet);
  sVar1 = ::cm::operator____s("RETURN_VALUE",0xc);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->ReturnValue);
  sVar1 = ::cm::operator____s("CAPTURE_CMAKE_ERROR",0x13);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->CaptureCMakeError);
  sVar1 = ::cm::operator____s("SOURCE",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Source);
  sVar1 = ::cm::operator____s("BUILD",5);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->Build);
  sVar1 = ::cm::operator____s("SUBMIT_INDEX",0xc);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&this->super_cmArgumentParser<void>,sVar1,&this->SubmitIndex);
  return;
}

Assistant:

void cmCTestHandlerCommand::BindArguments()
{
  this->BindParsedKeywords(this->ParsedKeywords);
  this->Bind("APPEND"_s, this->Append);
  this->Bind("QUIET"_s, this->Quiet);
  this->Bind("RETURN_VALUE"_s, this->ReturnValue);
  this->Bind("CAPTURE_CMAKE_ERROR"_s, this->CaptureCMakeError);
  this->Bind("SOURCE"_s, this->Source);
  this->Bind("BUILD"_s, this->Build);
  this->Bind("SUBMIT_INDEX"_s, this->SubmitIndex);
}